

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

ClassArray<soplex::Nonzero<double>_> * __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::operator=
          (ClassArray<soplex::Nonzero<double>_> *this,ClassArray<soplex::Nonzero<double>_> *rhs)

{
  Nonzero<double> *pNVar1;
  Nonzero<double> *pNVar2;
  long lVar3;
  int i;
  long lVar4;
  
  if (this != rhs) {
    reSize(this,rhs->thesize);
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < this->thesize; lVar4 = lVar4 + 1) {
      pNVar1 = rhs->data;
      pNVar2 = this->data;
      *(undefined4 *)((long)&pNVar2->idx + lVar3) = *(undefined4 *)((long)&pNVar1->idx + lVar3);
      *(undefined8 *)((long)&pNVar2->val + lVar3) = *(undefined8 *)((long)&pNVar1->val + lVar3);
      lVar3 = lVar3 + 0x10;
    }
  }
  return this;
}

Assistant:

ClassArray& operator=(const ClassArray& rhs)
   {
      if(this != &rhs)
      {
         reSize(rhs.size());

         for(int i = 0; i < size(); i++)
            data[i] = rhs.data[i];

         assert(isConsistent());
      }

      return *this;
   }